

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
          (Coroutine<kj::HttpServer::Connection::LoopResult> *this,
          FixVoid<kj::HttpServer::Connection::LoopResult> *value)

{
  bool bVar1;
  LoopResult *value_00;
  ExceptionOr<kj::HttpServer::Connection::LoopResult> local_1b8;
  LoopResult *local_18;
  FixVoid<kj::HttpServer::Connection::LoopResult> *value_local;
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<kj::HttpServer::Connection::LoopResult> *)this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<kj::HttpServer::Connection::LoopResult>(local_18);
    ExceptionOr<kj::HttpServer::Connection::LoopResult>::ExceptionOr(&local_1b8,value_00);
    ExceptionOr<kj::HttpServer::Connection::LoopResult>::operator=(&this->result,&local_1b8);
    ExceptionOr<kj::HttpServer::Connection::LoopResult>::~ExceptionOr(&local_1b8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }